

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::compiler::Compiler::CompiledType> * __thiscall
capnp::compiler::Compiler::CompiledType::getMember
          (Maybe<capnp::compiler::Compiler::CompiledType> *__return_storage_ptr__,CompiledType *this
          ,StringPtr name)

{
  Compiler *compiler;
  Reader subSource;
  StringPtr memberName;
  BrandedDecl *pBVar1;
  NullableValue<capnp::compiler::BrandedDecl> *other;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *other_00;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_418;
  CompiledType local_368;
  BrandedDecl *local_2b0;
  BrandedDecl *member;
  CapTableReader *pCStack_2a0;
  void *local_298;
  WirePointer *pWStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  char *local_278;
  size_t sStack_270;
  Maybe<capnp::compiler::BrandedDecl> local_268;
  undefined1 local_1b8 [8];
  NullableValue<capnp::compiler::BrandedDecl> _member1401;
  undefined1 local_f0 [8];
  Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  undefined1 local_d8 [6];
  bool found;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> newDecl;
  CompiledType *this_local;
  StringPtr name_local;
  
  newDecl.value.source._reader._40_8_ = this;
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::ExternalMutexGuarded
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_d8);
  lock.ptr._6_1_ = 0;
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockShared
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_f0,
             &this->compiler->impl);
  pBVar1 = kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::
           get<kj::Own<capnp::compiler::Compiler::Impl,decltype(nullptr)>const>
                     (&this->decl,
                      (Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
                      local_f0);
  local_288._0_4_ = 0;
  local_288._4_2_ = 0;
  local_288._6_2_ = 0;
  uStack_280._0_4_ = 0;
  uStack_280._4_4_ = 0;
  local_298 = (void *)0x0;
  pWStack_290 = (WirePointer *)0x0;
  member = (BrandedDecl *)0x0;
  pCStack_2a0 = (CapTableReader *)0x0;
  local_278 = name.content.ptr;
  sStack_270 = name.content.size_;
  Expression::Reader::Reader((Reader *)&member);
  memberName.content.size_ = sStack_270;
  memberName.content.ptr = local_278;
  subSource._reader.capTable = pCStack_2a0;
  subSource._reader.segment = (SegmentReader *)member;
  subSource._reader.data = local_298;
  subSource._reader.pointers = pWStack_290;
  subSource._reader.dataSize = (StructDataBitCount)local_288;
  subSource._reader.pointerCount = local_288._4_2_;
  subSource._reader._38_2_ = local_288._6_2_;
  subSource._reader.nestingLimit = (int)uStack_280;
  subSource._reader._44_4_ = uStack_280._4_4_;
  BrandedDecl::getMember(&local_268,pBVar1,memberName,subSource);
  other = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_268);
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_1b8,other);
  kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_268);
  pBVar1 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_1b8);
  if (pBVar1 != (BrandedDecl *)0x0) {
    local_2b0 = kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                          ((NullableValue<capnp::compiler::BrandedDecl> *)local_1b8);
    pBVar1 = kj::mv<capnp::compiler::BrandedDecl>(local_2b0);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::
    set<kj::Own<capnp::compiler::Compiler::Impl,decltype(nullptr)>const>
              ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_d8,
               (Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_f0,
               pBVar1);
    lock.ptr._6_1_ = 1;
  }
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_1b8);
  kj::Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_f0);
  if ((lock.ptr._6_1_ & 1) == 0) {
    kj::Maybe<capnp::compiler::Compiler::CompiledType>::Maybe(__return_storage_ptr__);
  }
  else {
    compiler = this->compiler;
    other_00 = kj::mv<kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>>
                         ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_d8);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::ExternalMutexGuarded
              (&local_418,other_00);
    CompiledType(&local_368,compiler,&local_418);
    kj::Maybe<capnp::compiler::Compiler::CompiledType>::Maybe(__return_storage_ptr__,&local_368);
    ~CompiledType(&local_368);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_418);
  }
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Compiler::CompiledType> Compiler::CompiledType::getMember(kj::StringPtr name) {
  kj::ExternalMutexGuarded<BrandedDecl> newDecl;
  bool found = false;

  {
    auto lock = compiler.impl.lockShared();
    KJ_IF_SOME(member, decl.get(lock).getMember(name, {})) {
      newDecl.set(lock, kj::mv(member));
      found = true;
    }
  }

  if (found) {
    return CompiledType(compiler, kj::mv(newDecl));
  } else {
    return kj::none;
  }
}